

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O1

void tcu::decompress(PixelBufferAccess *dst,CompressedTexFormat fmt,deUint8 *src,
                    TexDecompressionParams *params)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int i;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int width;
  byte bVar17;
  int iVar18;
  deUint8 *src_00;
  ulong uVar19;
  byte bVar20;
  int i_2;
  uint uVar21;
  int iVar22;
  int depth;
  int height;
  bool bVar23;
  byte local_13c [2];
  deUint8 baseG [2];
  int local_134;
  IVec3 dstPixelPos;
  byte local_108;
  IVec3 blockPos;
  IVec3 blockPixelSize;
  PixelBufferAccess blockAccess;
  IVec3 blockPitches;
  Vector<int,_3> res;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedBlock;
  deUint8 baseR [2];
  byte bVar5;
  
  iVar6 = getBlockSize(fmt);
  getBlockPixelSize((tcu *)&blockPixelSize,fmt);
  iVar7 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar12 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar18 = (iVar7 / blockPixelSize.m_data[0] + 1) - (uint)(iVar7 % blockPixelSize.m_data[0] == 0);
  iVar12 = (iVar12 / blockPixelSize.m_data[1] + 1) - (uint)(iVar12 % blockPixelSize.m_data[1] == 0);
  iVar7 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
  iVar22 = (iVar7 / blockPixelSize.m_data[2] + 1) - (uint)(iVar7 % blockPixelSize.m_data[2] == 0);
  blockPitches.m_data[1] = iVar18 * iVar6;
  blockPitches.m_data[2] = iVar12 * blockPitches.m_data[1];
  blockPitches.m_data[0] = iVar6;
  iVar7 = TextureFormat::getPixelSize((TextureFormat *)dst);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&uncompressedBlock,
             (long)(iVar7 * blockPixelSize.m_data[0] * blockPixelSize.m_data[1] *
                   blockPixelSize.m_data[2]),(allocator_type *)&blockAccess);
  res.m_data._0_8_ = getUncompressedFormat(fmt);
  PixelBufferAccess::PixelBufferAccess
            (&blockAccess,(TextureFormat *)&res,blockPixelSize.m_data[0],blockPixelSize.m_data[1],
             blockPixelSize.m_data[2],
             uncompressedBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start);
  if (0 < iVar22) {
    iVar7 = 0;
    do {
      if (0 < iVar12) {
        local_134 = 0;
        do {
          if (0 < iVar18) {
            iVar6 = 0;
            do {
              blockPos.m_data[0] = iVar6;
              blockPos.m_data[1] = local_134;
              blockPos.m_data[2] = iVar7;
              res.m_data[2] = 0;
              res.m_data[0] = 0;
              res.m_data[1] = 0;
              lVar8 = 0;
              do {
                res.m_data[lVar8] = blockPitches.m_data[lVar8] * blockPos.m_data[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              width = (dst->super_ConstPixelBufferAccess).m_size.m_data[0] -
                      blockPixelSize.m_data[0] * iVar6;
              height = (dst->super_ConstPixelBufferAccess).m_size.m_data[1] -
                       blockPixelSize.m_data[1] * local_134;
              depth = (dst->super_ConstPixelBufferAccess).m_size.m_data[2] -
                      blockPixelSize.m_data[2] * iVar7;
              dstPixelPos.m_data[2] = 0;
              dstPixelPos.m_data[0] = 0;
              dstPixelPos.m_data[1] = 0;
              lVar8 = 0;
              do {
                dstPixelPos.m_data[lVar8] = blockPixelSize.m_data[lVar8] * blockPos.m_data[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              src_00 = src + (res.m_data[1] + res.m_data[0] + res.m_data[2]);
              if (blockPixelSize.m_data[0] < width) {
                width = blockPixelSize.m_data[0];
              }
              if (blockPixelSize.m_data[1] < height) {
                height = blockPixelSize.m_data[1];
              }
              if (blockPixelSize.m_data[2] < depth) {
                depth = blockPixelSize.m_data[2];
              }
              if (fmt - COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA < 0x1c) {
                astc::decompress(&blockAccess,src_00,fmt,params->astcMode);
                goto switchD_019cbe54_default;
              }
              switch(fmt) {
              case COMPRESSEDTEXFORMAT_ETC1_RGB8:
                lVar8 = 0;
                uVar9 = 0;
                do {
                  uVar19 = uVar9;
                  uVar15 = uVar19 << 8;
                  uVar9 = src_00[lVar8] | uVar15;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 8);
                uVar1 = (uint)(uVar19 >> 0x18);
                res.m_data._0_8_ = CONCAT44(uVar1 >> 2,uVar1 >> 5) & 0x700000007;
                bVar10 = (byte)(uVar19 >> 0x20);
                bVar11 = (byte)(uVar19 >> 0x30);
                bVar20 = (byte)(uVar19 >> 0x28);
                if (((uint)uVar19 >> 0x19 & 1) == 0) {
                  baseR[0] = (byte)((uVar1 >> 0x1c) << 4) | bVar11 >> 4;
                  baseR[1] = bVar11 << 4 | bVar11 & 0xf;
                  bVar11 = (byte)(uVar15 >> 0x34);
                  baseG[0] = bVar11 << 4 | bVar11 & 0xf;
                  baseG[1] = bVar20 << 4 | bVar20 & 0xf;
                  bVar11 = (byte)(uVar15 >> 0x2c);
                  local_13c[0] = bVar11 << 4 | bVar11 & 0xf;
                  local_13c[1] = bVar10 << 4 | bVar10 & 0xf;
                }
                else {
                  bVar2 = (byte)(uVar15 >> 0x33);
                  bVar3 = bVar2 & 0x1f;
                  bVar5 = (byte)(uVar15 >> 0x2b);
                  bVar4 = bVar5 & 0x1f;
                  local_108 = bVar11 & 0xf8;
                  bVar17 = ((char)(bVar11 << 5) >> 7 & 0xf8U) + (bVar11 & 7) + (bVar11 >> 3);
                  baseR[0] = (bVar11 >> 5) + local_108;
                  bVar20 = ((char)(bVar20 << 5) >> 7 & 0xf8U) + (bVar20 & 7) + bVar3;
                  baseG[0] = bVar3 >> 2 | bVar2 << 3;
                  bVar11 = ((char)(bVar10 << 5) >> 7 & 0xf8U | bVar10 & 7) + bVar4;
                  local_13c[0] = bVar4 >> 2 | bVar5 << 3;
                  baseR[1] = bVar17 >> 2 | bVar17 * '\b';
                  baseG[1] = bVar20 >> 2 | bVar20 * '\b';
                  local_13c[1] = bVar11 >> 2 | bVar11 * '\b';
                }
                uVar15 = 0;
                do {
                  uVar1 = (uint)(uVar15 >> 2) & 0x3fffffff;
                  uVar21 = (uint)uVar15 & 3;
                  uVar13 = uVar21;
                  if (((uint)uVar19 >> 0x18 & 1) == 0) {
                    uVar13 = uVar1;
                  }
                  bVar23 = 1 < uVar13;
                  iVar14 = anon_unknown_0::EtcDecompressInternal::decompressETC2Block::modifierTable
                           [(uint)res.m_data[bVar23]]
                           [(uint)((uVar9 >> (uVar15 & 0x3f) & 1) != 0) +
                            ((uint)(uVar9 >> ((char)uVar15 + 0x10U & 0x3f)) & 1) * 2];
                  iVar16 = (uint)baseR[bVar23] + iVar14;
                  if (0xfe < iVar16) {
                    iVar16 = 0xff;
                  }
                  if (iVar16 < 1) {
                    iVar16 = 0;
                  }
                  lVar8 = (ulong)(uVar1 + uVar21 * 4) * 3;
                  *(char *)((long)blockAccess.super_ConstPixelBufferAccess.m_data + lVar8) =
                       (char)iVar16;
                  iVar16 = (uint)baseG[bVar23] + iVar14;
                  if (0xfe < iVar16) {
                    iVar16 = 0xff;
                  }
                  if (iVar16 < 1) {
                    iVar16 = 0;
                  }
                  *(char *)((long)blockAccess.super_ConstPixelBufferAccess.m_data + lVar8 + 1) =
                       (char)iVar16;
                  iVar14 = iVar14 + (uint)local_13c[bVar23];
                  if (0xfe < iVar14) {
                    iVar14 = 0xff;
                  }
                  if (iVar14 < 1) {
                    iVar14 = 0;
                  }
                  *(char *)((long)blockAccess.super_ConstPixelBufferAccess.m_data + lVar8 + 2) =
                       (char)iVar14;
                  uVar15 = uVar15 + 1;
                } while (uVar15 != 0x10);
                break;
              case COMPRESSEDTEXFORMAT_EAC_R11:
                bVar23 = false;
                goto LAB_019cbf7f;
              case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:
                bVar23 = true;
LAB_019cbf7f:
                anon_unknown_0::decompressEAC_R11(&blockAccess,src_00,bVar23);
                break;
              case COMPRESSEDTEXFORMAT_EAC_RG11:
                bVar23 = false;
                goto LAB_019cbf6c;
              case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:
                bVar23 = true;
LAB_019cbf6c:
                anon_unknown_0::decompressEAC_RG11(&blockAccess,src_00,bVar23);
                break;
              case COMPRESSEDTEXFORMAT_ETC2_RGB8:
                lVar8 = 0;
                uVar9 = 0;
                do {
                  uVar9 = (ulong)src_00[lVar8] | uVar9 << 8;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 8);
                goto LAB_019cbfd1;
              case COMPRESSEDTEXFORMAT_ETC2_SRGB8:
                lVar8 = 0;
                uVar9 = 0;
                do {
                  uVar9 = (ulong)src_00[lVar8] | uVar9 << 8;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 8);
LAB_019cbfd1:
                anon_unknown_0::EtcDecompressInternal::decompressETC2Block
                          ((deUint8 *)blockAccess.super_ConstPixelBufferAccess.m_data,uVar9,
                           (deUint8 *)0x0,false);
                break;
              case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:
              case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:
                anon_unknown_0::decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1(&blockAccess,src_00);
                break;
              case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:
              case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:
                anon_unknown_0::decompressETC2_EAC_RGBA8(&blockAccess,src_00);
              }
switchD_019cbe54_default:
              getSubregion((PixelBufferAccess *)&res,dst,dstPixelPos.m_data[0],dstPixelPos.m_data[1]
                           ,dstPixelPos.m_data[2],width,height,depth);
              getSubregion((PixelBufferAccess *)baseR,&blockAccess,0,0,0,width,height,depth);
              copy((EVP_PKEY_CTX *)&res,(EVP_PKEY_CTX *)baseR);
              iVar6 = iVar6 + 1;
            } while (iVar6 != iVar18);
          }
          local_134 = local_134 + 1;
        } while (local_134 != iVar12);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar22);
  }
  if (uncompressedBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(uncompressedBlock.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)uncompressedBlock.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)uncompressedBlock.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void decompress (const PixelBufferAccess& dst, CompressedTexFormat fmt, const deUint8* src, const TexDecompressionParams& params)
{
	const int				blockSize			= getBlockSize(fmt);
	const IVec3				blockPixelSize		(getBlockPixelSize(fmt));
	const IVec3				blockCount			(deDivRoundUp32(dst.getWidth(),		blockPixelSize.x()),
												 deDivRoundUp32(dst.getHeight(),	blockPixelSize.y()),
												 deDivRoundUp32(dst.getDepth(),		blockPixelSize.z()));
	const IVec3				blockPitches		(blockSize, blockSize * blockCount.x(), blockSize * blockCount.x() * blockCount.y());

	std::vector<deUint8>	uncompressedBlock	(dst.getFormat().getPixelSize() * blockPixelSize.x() * blockPixelSize.y() * blockPixelSize.z());
	const PixelBufferAccess	blockAccess			(getUncompressedFormat(fmt), blockPixelSize.x(), blockPixelSize.y(), blockPixelSize.z(), &uncompressedBlock[0]);

	DE_ASSERT(dst.getFormat() == getUncompressedFormat(fmt));

	for (int blockZ = 0; blockZ < blockCount.z(); blockZ++)
	for (int blockY = 0; blockY < blockCount.y(); blockY++)
	for (int blockX = 0; blockX < blockCount.x(); blockX++)
	{
		const IVec3				blockPos	(blockX, blockY, blockZ);
		const deUint8* const	blockPtr	= src + componentSum(blockPos * blockPitches);
		const IVec3				copySize	(de::min(blockPixelSize.x(), dst.getWidth()		- blockPos.x() * blockPixelSize.x()),
											 de::min(blockPixelSize.y(), dst.getHeight()	- blockPos.y() * blockPixelSize.y()),
											 de::min(blockPixelSize.z(), dst.getDepth()		- blockPos.z() * blockPixelSize.z()));
		const IVec3				dstPixelPos	= blockPos * blockPixelSize;

		decompressBlock(fmt, blockAccess, blockPtr, params);

		copy(getSubregion(dst, dstPixelPos.x(), dstPixelPos.y(), dstPixelPos.z(), copySize.x(), copySize.y(), copySize.z()), getSubregion(blockAccess, 0, 0, 0, copySize.x(), copySize.y(), copySize.z()));
	}
}